

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::FastInstancesIterator::
~FastInstancesIterator(FastInstancesIterator *this)

{
  Lib::
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>::
  ~Stack(&this->_nodeTypes);
  Lib::Stack<unsigned_int>::~Stack(&this->_specVarNumbers);
  Lib::Stack<void_*>::~Stack(&this->_alternatives);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            (&(this->_resultDenormalizer)._data);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::~InstMatcher
            (&this->_subst);
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::~VirtualIterator
            (&this->_ldIterator);
  return;
}

Assistant:

FastInstancesIterator(FastInstancesIterator&&) = default;